

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_impl.cpp
# Opt level: O1

MPP_RET mpp_dump_init(MppDump *info)

{
  undefined8 *puVar1;
  pthread_mutex_t *__mutex;
  long lVar2;
  RK_S64 RVar3;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_2c;
  
  if ((mpp_debug & 0xe00) == 0) {
    puVar1 = (undefined8 *)0x0;
  }
  else {
    puVar1 = (undefined8 *)mpp_osal_calloc("mpp_dump_init",0x60);
    mpp_env_get_u32("mpp_dump_width",(RK_U32 *)((long)puVar1 + 0x4c),0);
    mpp_env_get_u32("mpp_dump_height",(RK_U32 *)(puVar1 + 10),0);
    *(uint *)((long)puVar1 + 0x54) =
         (uint)(*(int *)((long)puVar1 + 0x4c) * *(int *)(puVar1 + 10) * 3) >> 1;
    __mutex = (pthread_mutex_t *)operator_new(0x28);
    pthread_mutexattr_init(&local_2c);
    pthread_mutexattr_settype(&local_2c,1);
    pthread_mutex_init(__mutex,&local_2c);
    pthread_mutexattr_destroy(&local_2c);
    *puVar1 = __mutex;
    *(RK_U32 *)((long)puVar1 + 0xc) = mpp_debug;
    lVar2 = syscall(0xba);
    *(int *)(puVar1 + 2) = (int)lVar2;
    *(undefined4 *)(puVar1 + 1) = 0;
    RVar3 = mpp_time();
    puVar1[3] = RVar3;
  }
  *info = puVar1;
  return MPP_OK;
}

Assistant:

MPP_RET mpp_dump_init(MppDump *info)
{
    if (!(mpp_debug & (MPP_DBG_DUMP_IN | MPP_DBG_DUMP_OUT | MPP_DBG_DUMP_CFG))) {
        *info = NULL;
        return MPP_OK;
    }

    MppDumpImpl *p = mpp_calloc(MppDumpImpl, 1);

    mpp_env_get_u32("mpp_dump_width", &p->dump_width, 0);
    mpp_env_get_u32("mpp_dump_height", &p->dump_height, 0);
    p->dump_size = p->dump_width * p->dump_height * 3 / 2;

    p->lock = new Mutex();
    p->debug = mpp_debug;
    p->tid = syscall(SYS_gettid);
    p->log_version = 0;
    p->time_base = mpp_time();

    *info = p;

    return MPP_OK;
}